

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_mul_v_s128_256_1280(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  undefined1 auVar1 [64];
  uint w;
  int iVar2;
  uint i;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 local_a8 [64];
  word local_68;
  word wStack_60;
  word local_58;
  word wStack_50;
  word local_48;
  word wStack_40;
  word wStack_38;
  word wStack_30;
  word wStack_28;
  word wStack_20;
  word wStack_18;
  word wStack_10;
  
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar7);
  wStack_28 = auVar1._32_8_;
  wStack_20 = auVar1._40_8_;
  wStack_18 = auVar1._48_8_;
  wStack_10 = auVar1._56_8_;
  auVar1 = vmovdqu64_avx512f(auVar7);
  local_68 = auVar1._0_8_;
  wStack_60 = auVar1._8_8_;
  local_58 = auVar1._16_8_;
  wStack_50 = auVar1._24_8_;
  local_48 = auVar1._32_8_;
  wStack_40 = auVar1._40_8_;
  wStack_38 = auVar1._48_8_;
  wStack_30 = auVar1._56_8_;
  local_a8 = vmovdqu64_avx512f(auVar7);
  iVar2 = 4;
  do {
    iVar3 = 0x40;
    do {
      auVar5 = vpbroadcastq_avx512vl();
      lVar4 = 0;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [16])(local_a8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_a8 + lVar4) = auVar6;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x20);
      lVar4 = 0x20;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [16])(local_a8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_a8 + lVar4) = auVar6;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x40);
      lVar4 = 0x40;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [16])(local_a8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_a8 + lVar4) = auVar6;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x60);
      lVar4 = 0x60;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [16])(local_a8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_a8 + lVar4) = auVar6;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0x80);
      lVar4 = 0x80;
      do {
        auVar6 = vpternlogq_avx512vl(*(undefined1 (*) [16])((long)A->w64 + lVar4),auVar5,
                                     *(undefined1 (*) [16])(local_a8 + lVar4),0x6a);
        *(undefined1 (*) [16])(local_a8 + lVar4) = auVar6;
        lVar4 = lVar4 + 0x10;
      } while (lVar4 != 0xa0);
      A = A + 5;
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  c->w64[0] = local_a8._0_8_;
  c->w64[1] = local_a8._8_8_;
  c->w64[2] = local_a8._16_8_;
  c->w64[3] = local_a8._24_8_;
  c[1].w64[0] = local_a8._32_8_;
  c[1].w64[1] = local_a8._40_8_;
  c[1].w64[2] = local_a8._48_8_;
  c[1].w64[3] = local_a8._56_8_;
  c[2].w64[0] = local_68;
  c[2].w64[1] = wStack_60;
  c[2].w64[2] = local_58;
  c[2].w64[3] = wStack_50;
  c[3].w64[0] = local_48;
  c[3].w64[1] = wStack_40;
  c[3].w64[2] = wStack_38;
  c[3].w64[3] = wStack_30;
  c[4].w64[0] = wStack_28;
  c[4].w64[1] = wStack_20;
  c[4].w64[2] = wStack_18;
  c[4].w64[3] = wStack_10;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_256_1280(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[10] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero,
                      mm128_zero, mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 4; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 5) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      mm128_xor_mask_region(&cval[4], Ablock[2].w64, mask, 2);
      mm128_xor_mask_region(&cval[6], Ablock[3].w64, mask, 2);
      mm128_xor_mask_region(&cval[8], Ablock[4].w64, mask, 2);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  block_t* cblock4 = BLOCK(c, 3);
  block_t* cblock5 = BLOCK(c, 4);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
  mm128_store(&cblock3->w64[2], cval[5]);
  mm128_store(&cblock4->w64[0], cval[6]);
  mm128_store(&cblock4->w64[2], cval[7]);
  mm128_store(&cblock5->w64[0], cval[8]);
  mm128_store(&cblock5->w64[2], cval[9]);
}